

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

void mp_next_slowpath(char **data,int64_t k)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  
  do {
    if (k < 1) {
      return;
    }
    pbVar5 = (byte *)*data;
    bVar1 = *pbVar5;
    *data = (char *)(pbVar5 + 1);
    bVar2 = ""[bVar1];
    lVar7 = (long)(char)bVar2;
    if (-1 < lVar7) {
      if (((k & 0x3fU) == 0) && (bVar2 == 0)) {
        pbVar5 = pbVar5 + 9;
        for (; 8 < (ulong)k; k = k - 8) {
          uVar6 = *(ulong *)(pbVar5 + -8);
          *data = (char *)pbVar5;
          if ((uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
               | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
               (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38) !=
              (ulong)bVar1 * 0x101010101010101) {
            pbVar5 = pbVar5 + -8;
            goto LAB_00129dce;
          }
          pbVar5 = pbVar5 + 8;
        }
      }
      else {
        *data = (char *)(pbVar5 + 1 + lVar7);
      }
      goto LAB_00129d93;
    }
    if (0xe0 < bVar2) {
      k = k - lVar7;
      goto LAB_00129d93;
    }
    switch(bVar2) {
    case 0xd7:
      uVar4 = *(uint *)(pbVar5 + 1);
      pbVar5 = pbVar5 + (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18) + 6;
      break;
    case 0xd8:
      pbVar5 = pbVar5 + (ulong)(ushort)(*(ushort *)(pbVar5 + 1) << 8 | *(ushort *)(pbVar5 + 1) >> 8)
                        + 4;
      break;
    case 0xd9:
      uVar6 = (ulong)pbVar5[1];
      goto LAB_00129ebd;
    case 0xda:
      uVar4 = *(uint *)(pbVar5 + 1);
      *data = (char *)(pbVar5 + 5);
      k = k + (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18) * 2;
      goto LAB_00129d93;
    case 0xdb:
      uVar3 = *(ushort *)(pbVar5 + 1);
      *data = (char *)(pbVar5 + 3);
      k = k + (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8) * 2;
      goto LAB_00129d93;
    case 0xdc:
      uVar4 = *(uint *)(pbVar5 + 1);
      *data = (char *)(pbVar5 + 5);
      k = k + (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18);
      goto LAB_00129d93;
    case 0xdd:
      uVar3 = *(ushort *)(pbVar5 + 1);
      *data = (char *)(pbVar5 + 3);
      k = k + (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
      goto LAB_00129d93;
    case 0xde:
      uVar4 = *(uint *)(pbVar5 + 1);
      pbVar5 = pbVar5 + (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18) + 5;
      break;
    case 0xdf:
      uVar6 = (ulong)(ushort)(*(ushort *)(pbVar5 + 1) << 8 | *(ushort *)(pbVar5 + 1) >> 8);
LAB_00129ebd:
      pbVar5 = pbVar5 + uVar6 + 3;
      break;
    case 0xe0:
      pbVar5 = pbVar5 + (ulong)pbVar5[1] + 2;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xc87,"void mp_next_slowpath(const char **, int64_t)");
    }
LAB_00129dce:
    *data = (char *)pbVar5;
LAB_00129d93:
    k = k - 1;
  } while( true );
}

Assistant:

MP_IMPL void
mp_next_slowpath(const char **data, int64_t k)
{
	for (; k > 0; k--) {
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			/*
			 *  Same one-byte-encoded-value optimisation.
			 *  Good for skipping tons of NILs, zeros etc.
			 *  Run not more than once per 64 cycles (or about)
			 * in order to avoid degradation for other cases.
			 *  Note that l == 0 means that the last byte (that is
			 * in variable `c`) is one-byte-encoded-value.
			 *  The idea of optimization is to read the next 8 bytes
			 * as one 8byte uint and check if all bytes of that
			 * word are the same value (`c`). If so - skip 8 bytes
			 * at once and repeat.
			 *  A small trick is used to create an 8byte uint that
			 * consists of 8 bytes that equal to one byte (`c`):
			 * by rules of multiplication if multiply an one-byte
			 * value (for example 0xab) by 0x0101010101010101 we
			 * will get 0xabababababababab. That works for any byte.
			 */
			if (mp_unlikely(l == 0 && k % 64 == 0)) {
				/*
				 * Check k > 8 that there are at least 8 values
				 * more expected, that are at least 8 bytes of
				 * total length, that allows us to read 8 bytes.
				 */
				while (k > 8) {
					const char *save = *data;
					uint64_t u = mp_load_u64(data);
					/*
					 * Check that `u` is 8 `c` bytes,
					 * see the trick explanation above.
					 */
					if (u != c * 0x0101010101010101ull) {
						/* Wrong, restore pointer. */
						*data = save;
						break;
					}
					/* Confirm reading of 8 values. */
					k -= 8;
				}
				continue;
			}
			*data += l;
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		uint32_t len;
		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			len = mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			len = mp_load_u16(data);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			len = mp_load_u32(data);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			k += 2 * (uint32_t)mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			k += 2 * (uint64_t)mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			len = mp_load_u8(data);
			mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			len = mp_load_u16(data);
			mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			len = mp_load_u32(data);
			mp_load_u8(data);
			*data += len;
			break;
		default:
			mp_unreachable();
		}
	}
}